

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::RunWorkqOnEmptyString(DFA *this,Workq *oldq,Workq *newq,uint flag)

{
  int *piVar1;
  int id;
  int *piVar2;
  
  (newq->super_SparseSet).size_ = 0;
  newq->nextmark_ = newq->n_;
  piVar1 = (oldq->super_SparseSet).dense_;
  for (piVar2 = piVar1; piVar2 != piVar1 + (oldq->super_SparseSet).size_; piVar2 = piVar2 + 1) {
    id = *piVar2;
    if (oldq->n_ <= id) {
      id = -1;
    }
    AddToQueue(this,newq,id,flag);
    piVar1 = (oldq->super_SparseSet).dense_;
  }
  return;
}

Assistant:

void DFA::RunWorkqOnEmptyString(Workq* oldq, Workq* newq, uint flag) {
  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i))
      AddToQueue(newq, Mark, flag);
    else
      AddToQueue(newq, *i, flag);
  }
}